

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::ArgMinMaxState<short,long>,short,long,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (short *adata,AggregateInputData *aggr_input_data,long *bdata,
               ArgMinMaxState<short,_long> **states,idx_t count,SelectionVector *asel,
               SelectionVector *bsel,SelectionVector *ssel,ValidityMask *avalidity,
               ValidityMask *bvalidity)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  ArgMinMaxState<short,_long> *pAVar5;
  long lVar6;
  unsigned_long *puVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  idx_t iVar14;
  idx_t iVar15;
  
  puVar1 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = asel->sel_vector;
      psVar3 = bsel->sel_vector;
      psVar4 = ssel->sel_vector;
      uVar10 = 0;
      do {
        uVar11 = uVar10;
        if (psVar2 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar2[uVar10];
        }
        uVar8 = uVar10;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar10];
        }
        uVar13 = uVar10;
        if (psVar4 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar4[uVar10];
        }
        pAVar5 = states[uVar13];
        if ((pAVar5->super_ArgMinMaxStateBase).is_initialized == false) {
          pAVar5->arg = adata[uVar11];
          pAVar5->value = bdata[uVar8];
          (pAVar5->super_ArgMinMaxStateBase).is_initialized = true;
        }
        else {
          lVar6 = bdata[uVar8];
          if (lVar6 < pAVar5->value) {
            pAVar5->arg = adata[uVar11];
            pAVar5->value = lVar6;
          }
        }
        uVar10 = uVar10 + 1;
      } while (count != uVar10);
    }
  }
  else if (count != 0) {
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = ssel->sel_vector;
    puVar7 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar9 = 0;
    do {
      iVar14 = iVar9;
      if (psVar2 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar2[iVar9];
      }
      iVar15 = iVar9;
      if (psVar3 != (sel_t *)0x0) {
        iVar15 = (idx_t)psVar3[iVar9];
      }
      iVar12 = iVar9;
      if (psVar4 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar4[iVar9];
      }
      if (((puVar1 == (unsigned_long *)0x0) || ((puVar1[iVar14 >> 6] >> (iVar14 & 0x3f) & 1) != 0))
         && ((puVar7 == (unsigned_long *)0x0 || ((puVar7[iVar15 >> 6] >> (iVar15 & 0x3f) & 1) != 0))
            )) {
        pAVar5 = states[iVar12];
        if ((pAVar5->super_ArgMinMaxStateBase).is_initialized == false) {
          pAVar5->arg = adata[iVar14];
          pAVar5->value = bdata[iVar15];
          (pAVar5->super_ArgMinMaxStateBase).is_initialized = true;
        }
        else {
          lVar6 = bdata[iVar15];
          if (lVar6 < pAVar5->value) {
            pAVar5->arg = adata[iVar14];
            pAVar5->value = lVar6;
          }
        }
      }
      iVar9 = iVar9 + 1;
    } while (count != iVar9);
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}